

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O3

void recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *buf,sockaddr *addr,uint flags)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined1 *puVar6;
  uv_udp_t *unaff_RBX;
  undefined1 *puVar7;
  undefined1 auStack_670 [16];
  undefined1 auStack_65e [18];
  undefined8 uStack_64c;
  undefined8 uStack_644;
  undefined8 uStack_63c;
  undefined8 uStack_634;
  undefined8 uStack_62c;
  undefined8 uStack_624;
  undefined8 uStack_61c;
  undefined8 uStack_614;
  undefined8 uStack_60c;
  undefined4 uStack_604;
  undefined4 uStack_600;
  undefined4 uStack_5fc;
  undefined8 uStack_5f8;
  undefined1 auStack_5f0 [216];
  undefined1 auStack_518 [320];
  ulong uStack_3d8;
  code *pcStack_3d0;
  undefined1 auStack_3c8 [16];
  sockaddr sStack_3b8;
  undefined1 auStack_3a8 [96];
  long lStack_348;
  undefined1 auStack_2d0 [216];
  code *pcStack_1f8;
  sockaddr sStack_1e8;
  undefined1 auStack_1d8 [216];
  code *pcStack_100;
  undefined1 auStack_f8 [216];
  uv_udp_t *puStack_20;
  
  if (nread < 0) {
    recv_cb_cold_7();
LAB_001899f4:
    recv_cb_cold_1();
LAB_001899f9:
    recv_cb_cold_5();
LAB_001899fe:
    recv_cb_cold_2();
LAB_00189a03:
    recv_cb_cold_3();
LAB_00189a08:
    recv_cb_cold_4();
  }
  else {
    if (nread != 0) {
      if (flags != 0) goto LAB_001899f4;
      if (addr == (sockaddr *)0x0) goto LAB_001899f9;
      if (nread != 4) goto LAB_001899fe;
      if (*(int *)buf->base != 0x474e4950) goto LAB_00189a03;
      iVar1 = uv_udp_recv_stop();
      unaff_RBX = handle;
      if (iVar1 == 0) {
        uv_close(handle,close_cb);
        return;
      }
      goto LAB_00189a08;
    }
    if (addr == (sockaddr *)0x0) {
      return;
    }
  }
  iVar1 = (int)nread;
  recv_cb_cold_6();
  if (addr == (sockaddr *)0x0) {
    send_cb_cold_2();
  }
  else if (iVar1 == 0) {
    send_cb_called = send_cb_called + 1;
    uVar4._0_2_ = addr[4].sa_family;
    uVar4._2_1_ = addr[4].sa_data[0];
    uVar4._3_1_ = addr[4].sa_data[1];
    uVar4._4_1_ = addr[4].sa_data[2];
    uVar4._5_1_ = addr[4].sa_data[3];
    uVar4._6_1_ = addr[4].sa_data[4];
    uVar4._7_1_ = addr[4].sa_data[5];
    uv_close(uVar4,close_cb);
    return;
  }
  send_cb_cold_1();
  pcStack_100 = (code *)0x189a4e;
  puStack_20 = unaff_RBX;
  uVar2 = create_udp_socket();
  pcStack_100 = (code *)0x189a55;
  uVar3 = create_udp_socket();
  uVar5 = (ulong)uVar3;
  pcStack_100 = (code *)0x189a5c;
  uVar4 = uv_default_loop();
  pcStack_100 = (code *)0x189a67;
  iVar1 = uv_udp_init(uVar4,auStack_f8);
  if (iVar1 == 0) {
    pcStack_100 = (code *)0x189a79;
    iVar1 = uv_udp_open(auStack_f8,uVar2);
    if (iVar1 != 0) goto LAB_00189afa;
    pcStack_100 = (code *)0x189a87;
    iVar1 = uv_udp_open(auStack_f8,uVar3);
    if (iVar1 != -0x10) goto LAB_00189aff;
    pcStack_100 = (code *)0x189a93;
    iVar1 = close(uVar3);
    if (iVar1 != 0) goto LAB_00189b04;
    pcStack_100 = (code *)0x189aa1;
    uv_close(auStack_f8,0);
    pcStack_100 = (code *)0x189aa6;
    uVar4 = uv_default_loop();
    pcStack_100 = (code *)0x189ab0;
    uv_run(uVar4,0);
    pcStack_100 = (code *)0x189ab5;
    uVar5 = uv_default_loop();
    pcStack_100 = (code *)0x189ac9;
    uv_walk(uVar5,close_walk_cb,0);
    pcStack_100 = (code *)0x189ad3;
    uv_run(uVar5,0);
    pcStack_100 = (code *)0x189ad8;
    uVar4 = uv_default_loop();
    pcStack_100 = (code *)0x189ae0;
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      pcStack_100 = (code *)0x189ae9;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_100 = (code *)0x189afa;
    run_test_udp_open_twice_cold_1();
LAB_00189afa:
    pcStack_100 = (code *)0x189aff;
    run_test_udp_open_twice_cold_2();
LAB_00189aff:
    pcStack_100 = (code *)0x189b04;
    run_test_udp_open_twice_cold_3();
LAB_00189b04:
    pcStack_100 = (code *)0x189b09;
    run_test_udp_open_twice_cold_4();
  }
  pcStack_100 = run_test_udp_open_bound;
  run_test_udp_open_twice_cold_5();
  pcStack_1f8 = (code *)0x189b2c;
  pcStack_100 = (code *)uVar5;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_1e8);
  if (iVar1 == 0) {
    pcStack_1f8 = (code *)0x189b39;
    uVar3 = create_udp_socket();
    uVar5 = (ulong)uVar3;
    pcStack_1f8 = (code *)0x189b4c;
    iVar1 = bind(uVar3,&sStack_1e8,0x10);
    if (iVar1 != 0) goto LAB_00189c02;
    pcStack_1f8 = (code *)0x189b59;
    uVar4 = uv_default_loop();
    pcStack_1f8 = (code *)0x189b66;
    iVar1 = uv_udp_init(uVar4,auStack_1d8);
    if (iVar1 != 0) goto LAB_00189c07;
    pcStack_1f8 = (code *)0x189b7a;
    iVar1 = uv_udp_open(auStack_1d8,uVar3);
    if (iVar1 != 0) goto LAB_00189c0c;
    pcStack_1f8 = (code *)0x189b9a;
    iVar1 = uv_udp_recv_start(auStack_1d8,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_00189c11;
    pcStack_1f8 = (code *)0x189baa;
    uv_close(auStack_1d8,0);
    pcStack_1f8 = (code *)0x189baf;
    uVar4 = uv_default_loop();
    pcStack_1f8 = (code *)0x189bb9;
    uv_run(uVar4,0);
    pcStack_1f8 = (code *)0x189bbe;
    uVar5 = uv_default_loop();
    pcStack_1f8 = (code *)0x189bd2;
    uv_walk(uVar5,close_walk_cb,0);
    pcStack_1f8 = (code *)0x189bdc;
    uv_run(uVar5,0);
    pcStack_1f8 = (code *)0x189be1;
    uVar4 = uv_default_loop();
    pcStack_1f8 = (code *)0x189be9;
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      pcStack_1f8 = (code *)0x189bf2;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_1f8 = (code *)0x189c02;
    run_test_udp_open_bound_cold_1();
LAB_00189c02:
    pcStack_1f8 = (code *)0x189c07;
    run_test_udp_open_bound_cold_2();
LAB_00189c07:
    pcStack_1f8 = (code *)0x189c0c;
    run_test_udp_open_bound_cold_3();
LAB_00189c0c:
    pcStack_1f8 = (code *)0x189c11;
    run_test_udp_open_bound_cold_4();
LAB_00189c11:
    pcStack_1f8 = (code *)0x189c16;
    run_test_udp_open_bound_cold_5();
  }
  pcStack_1f8 = run_test_udp_open_connect;
  run_test_udp_open_bound_cold_6();
  pcStack_3d0 = (code *)0x189c34;
  pcStack_1f8 = (code *)uVar5;
  auStack_3c8 = uv_buf_init("PING",4);
  pcStack_3d0 = (code *)0x189c53;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_3b8);
  if (iVar1 == 0) {
    pcStack_3d0 = (code *)0x189c60;
    uVar3 = create_udp_socket();
    uVar5 = (ulong)uVar3;
    pcStack_3d0 = (code *)0x189c67;
    uVar4 = uv_default_loop();
    pcStack_3d0 = (code *)0x189c74;
    iVar1 = uv_udp_init(uVar4,auStack_3a8);
    if (iVar1 != 0) goto LAB_00189da9;
    pcStack_3d0 = (code *)0x189c8d;
    iVar1 = connect(uVar3,&sStack_3b8,0x10);
    if (iVar1 != 0) goto LAB_00189dae;
    pcStack_3d0 = (code *)0x189ca1;
    iVar1 = uv_udp_open(auStack_3a8,uVar3);
    if (iVar1 != 0) goto LAB_00189db3;
    pcStack_3d0 = (code *)0x189cae;
    uVar4 = uv_default_loop();
    pcStack_3d0 = (code *)0x189cbe;
    iVar1 = uv_udp_init(uVar4,auStack_2d0);
    if (iVar1 != 0) goto LAB_00189db8;
    pcStack_3d0 = (code *)0x189cda;
    iVar1 = uv_udp_bind(auStack_2d0,&sStack_3b8,0);
    if (iVar1 != 0) goto LAB_00189dbd;
    pcStack_3d0 = (code *)0x189cfd;
    iVar1 = uv_udp_recv_start(auStack_2d0,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_00189dc2;
    pcStack_3d0 = (code *)0x189d28;
    iVar1 = uv_udp_send(&send_req,auStack_3a8,auStack_3c8,1,0,send_cb);
    if (iVar1 != 0) goto LAB_00189dc7;
    pcStack_3d0 = (code *)0x189d35;
    uVar4 = uv_default_loop();
    pcStack_3d0 = (code *)0x189d3f;
    uv_run(uVar4,0);
    if (send_cb_called != 1) goto LAB_00189dcc;
    if (close_cb_called != 2) goto LAB_00189dd1;
    if (lStack_348 != 0) goto LAB_00189dd6;
    pcStack_3d0 = (code *)0x189d65;
    uVar5 = uv_default_loop();
    pcStack_3d0 = (code *)0x189d79;
    uv_walk(uVar5,close_walk_cb,0);
    pcStack_3d0 = (code *)0x189d83;
    uv_run(uVar5,0);
    pcStack_3d0 = (code *)0x189d88;
    uVar4 = uv_default_loop();
    pcStack_3d0 = (code *)0x189d90;
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      pcStack_3d0 = (code *)0x189d99;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_3d0 = (code *)0x189da9;
    run_test_udp_open_connect_cold_1();
LAB_00189da9:
    pcStack_3d0 = (code *)0x189dae;
    run_test_udp_open_connect_cold_2();
LAB_00189dae:
    pcStack_3d0 = (code *)0x189db3;
    run_test_udp_open_connect_cold_3();
LAB_00189db3:
    pcStack_3d0 = (code *)0x189db8;
    run_test_udp_open_connect_cold_4();
LAB_00189db8:
    pcStack_3d0 = (code *)0x189dbd;
    run_test_udp_open_connect_cold_5();
LAB_00189dbd:
    pcStack_3d0 = (code *)0x189dc2;
    run_test_udp_open_connect_cold_6();
LAB_00189dc2:
    pcStack_3d0 = (code *)0x189dc7;
    run_test_udp_open_connect_cold_7();
LAB_00189dc7:
    pcStack_3d0 = (code *)0x189dcc;
    run_test_udp_open_connect_cold_8();
LAB_00189dcc:
    pcStack_3d0 = (code *)0x189dd1;
    run_test_udp_open_connect_cold_9();
LAB_00189dd1:
    pcStack_3d0 = (code *)0x189dd6;
    run_test_udp_open_connect_cold_10();
LAB_00189dd6:
    pcStack_3d0 = (code *)0x189ddb;
    run_test_udp_open_connect_cold_11();
  }
  pcStack_3d0 = run_test_udp_send_unix;
  run_test_udp_open_connect_cold_12();
  uStack_3d8 = uVar5;
  pcStack_3d0 = (code *)(ulong)uVar2;
  auStack_670 = uv_buf_init("PING",4);
  puVar6 = (undefined1 *)uv_default_loop();
  uStack_644 = 0;
  uStack_63c = 0;
  uStack_634 = 0;
  uStack_62c = 0;
  uStack_624 = 0;
  uStack_61c = 0;
  uStack_614 = 0;
  uStack_60c = 0;
  uStack_604 = 0;
  uStack_600 = 0;
  uStack_5fc = 0;
  uStack_5f8 = 0;
  auStack_65e._0_2_ = 1;
  auStack_65e[2] = '/';
  auStack_65e[3] = 't';
  auStack_65e[4] = 'm';
  auStack_65e[5] = 'p';
  auStack_65e[6] = '/';
  auStack_65e[7] = 'u';
  auStack_65e[8] = 'v';
  auStack_65e[9] = '-';
  auStack_65e[10] = 't';
  auStack_65e[0xb] = 'e';
  auStack_65e[0xc] = 's';
  auStack_65e[0xd] = 't';
  auStack_65e[0xe] = '-';
  auStack_65e[0xf] = 's';
  auStack_65e[0x10] = 'o';
  auStack_65e[0x11] = 'c';
  uStack_64c = 0x6b;
  puVar7 = (undefined1 *)0x1;
  uVar2 = socket(1,1,0);
  if ((int)uVar2 < 0) {
    run_test_udp_send_unix_cold_1();
LAB_00189f74:
    run_test_udp_send_unix_cold_2();
LAB_00189f79:
    run_test_udp_send_unix_cold_3();
LAB_00189f7e:
    run_test_udp_send_unix_cold_4();
LAB_00189f83:
    run_test_udp_send_unix_cold_5();
  }
  else {
    unlink("/tmp/uv-test-sock");
    puVar7 = (undefined1 *)(ulong)uVar2;
    iVar1 = bind(uVar2,(sockaddr *)auStack_65e,0x6e);
    if (iVar1 != 0) goto LAB_00189f74;
    puVar7 = (undefined1 *)(ulong)uVar2;
    iVar1 = listen(uVar2,1);
    if (iVar1 != 0) goto LAB_00189f79;
    puVar7 = puVar6;
    iVar1 = uv_udp_init(puVar6,auStack_5f0);
    if (iVar1 != 0) goto LAB_00189f7e;
    puVar7 = auStack_5f0;
    iVar1 = uv_udp_open(puVar7,uVar2);
    if (iVar1 != 0) goto LAB_00189f83;
    uv_run(puVar6,0);
    puVar7 = auStack_518;
    iVar1 = uv_udp_send(puVar7,auStack_5f0,auStack_670,1,auStack_65e,0);
    if (iVar1 == 0) {
      uv_close(auStack_5f0,0);
      uv_run(puVar6,0);
      close(uVar2);
      unlink("/tmp/uv-test-sock");
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      puVar7 = (undefined1 *)uv_default_loop();
      iVar1 = uv_loop_close();
      if (iVar1 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_00189f8d;
    }
  }
  run_test_udp_send_unix_cold_6();
LAB_00189f8d:
  run_test_udp_send_unix_cold_7();
  if (puVar7 != (undefined1 *)0x0) {
    close_cb_called = close_cb_called + 1;
    return;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(puVar7,0);
  return;
}

Assistant:

static void recv_cb(uv_udp_t* handle,
                       ssize_t nread,
                       const uv_buf_t* buf,
                       const struct sockaddr* addr,
                       unsigned flags) {
  int r;

  if (nread < 0) {
    ASSERT(0 && "unexpected error");
  }

  if (nread == 0) {
    /* Returning unused buffer. Don't count towards sv_recv_cb_called */
    ASSERT_NULL(addr);
    return;
  }

  ASSERT(flags == 0);

  ASSERT_NOT_NULL(addr);
  ASSERT(nread == 4);
  ASSERT(memcmp("PING", buf->base, nread) == 0);

  r = uv_udp_recv_stop(handle);
  ASSERT(r == 0);

  uv_close((uv_handle_t*) handle, close_cb);
}